

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ml.c
# Opt level: O0

void av1_nn_predict_c(float *input_nodes,NN_CONFIG *nn_config,int reduce_prec,float *output)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  float *in_RCX;
  long lVar5;
  int in_EDX;
  int *in_RSI;
  float *in_RDI;
  int i_1;
  float val_1;
  int node_1;
  float *layer_bias;
  float *layer_weights;
  int i;
  float val;
  int node;
  int num_output_nodes;
  float *output_nodes;
  float *layer_bias_1;
  float *layer_weights_1;
  int layer;
  int num_layers;
  float buf [2] [128];
  int buf_index;
  int num_input_nodes;
  float local_478;
  int local_474;
  float local_470;
  int local_46c;
  int local_458;
  float local_454;
  int local_450;
  int local_430;
  float local_428 [256];
  int local_28;
  int local_24;
  float *local_8;
  
  local_28 = 0;
  iVar1 = in_RSI[2];
  local_24 = *in_RSI;
  local_8 = in_RDI;
  for (local_430 = 0; local_430 < iVar1; local_430 = local_430 + 1) {
    lVar3 = *(long *)(in_RSI + (long)local_430 * 2 + 0xe);
    lVar4 = *(long *)(in_RSI + (long)local_430 * 2 + 0x24);
    lVar5 = (long)local_28;
    iVar2 = in_RSI[(long)local_430 + 3];
    for (local_450 = 0; local_450 < iVar2; local_450 = local_450 + 1) {
      local_454 = *(float *)(lVar4 + (long)local_450 * 4);
      for (local_458 = 0; local_458 < local_24; local_458 = local_458 + 1) {
        local_454 = *(float *)(lVar3 + (long)(local_450 * local_24 + local_458) * 4) *
                    local_8[local_458] + local_454;
      }
      if (local_454 <= 0.0) {
        local_478 = 0.0;
      }
      else {
        local_478 = local_454;
      }
      (local_428 + lVar5 * 0x80)[local_450] = local_478;
    }
    local_28 = 1 - local_28;
    local_24 = iVar2;
    local_8 = local_428 + lVar5 * 0x80;
  }
  lVar3 = *(long *)(in_RSI + (long)iVar1 * 2 + 0xe);
  lVar4 = *(long *)(in_RSI + (long)iVar1 * 2 + 0x24);
  for (local_46c = 0; local_46c < in_RSI[1]; local_46c = local_46c + 1) {
    local_470 = *(float *)(lVar4 + (long)local_46c * 4);
    for (local_474 = 0; local_474 < local_24; local_474 = local_474 + 1) {
      local_470 = *(float *)(lVar3 + (long)(local_46c * local_24 + local_474) * 4) *
                  local_8[local_474] + local_470;
    }
    in_RCX[local_46c] = local_470;
  }
  if (in_EDX != 0) {
    av1_nn_output_prec_reduce(in_RCX,in_RSI[1]);
  }
  return;
}

Assistant:

void av1_nn_predict_c(const float *input_nodes,
                      const NN_CONFIG *const nn_config, int reduce_prec,
                      float *const output) {
  int num_input_nodes = nn_config->num_inputs;
  int buf_index = 0;
  float buf[2][NN_MAX_NODES_PER_LAYER];

  // Propagate hidden layers.
  const int num_layers = nn_config->num_hidden_layers;
  assert(num_layers <= NN_MAX_HIDDEN_LAYERS);
  for (int layer = 0; layer < num_layers; ++layer) {
    const float *layer_weights = nn_config->weights[layer];
    const float *layer_bias = nn_config->bias[layer];
    float *output_nodes = buf[buf_index];
    const int num_output_nodes = nn_config->num_hidden_nodes[layer];
    assert(num_output_nodes < NN_MAX_NODES_PER_LAYER);
    for (int node = 0; node < num_output_nodes; ++node) {
      float val = layer_bias[node];
      for (int i = 0; i < num_input_nodes; ++i)
        val += layer_weights[node * num_input_nodes + i] * input_nodes[i];
      // ReLU as activation function.
      val = val > 0.0f ? val : 0.0f;  // Could use AOMMAX().
      output_nodes[node] = val;
    }
    num_input_nodes = num_output_nodes;
    input_nodes = output_nodes;
    buf_index = 1 - buf_index;
  }

  // Final output layer.
  const float *layer_weights = nn_config->weights[num_layers];
  const float *layer_bias = nn_config->bias[num_layers];
  for (int node = 0; node < nn_config->num_outputs; ++node) {
    float val = layer_bias[node];
    for (int i = 0; i < num_input_nodes; ++i)
      val += layer_weights[node * num_input_nodes + i] * input_nodes[i];
    output[node] = val;
  }
  if (reduce_prec) av1_nn_output_prec_reduce(output, nn_config->num_outputs);
}